

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_clear_error(void)

{
  ERR_STATE *pEVar1;
  long lVar2;
  
  pEVar1 = err_get_state();
  if (pEVar1 != (ERR_STATE *)0x0) {
    for (lVar2 = 0; lVar2 != 0x180; lVar2 = lVar2 + 0x18) {
      err_clear((err_error_st *)((long)&pEVar1->errors[0].file + lVar2));
    }
    free(pEVar1->to_free);
    pEVar1->top = 0;
    pEVar1->bottom = 0;
    pEVar1->to_free = (void *)0x0;
  }
  return;
}

Assistant:

void ERR_clear_error(void) {
  ERR_STATE *const state = err_get_state();
  unsigned i;

  if (state == NULL) {
    return;
  }

  for (i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  state->to_free = NULL;

  state->top = state->bottom = 0;
}